

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O3

WCHAR * DumpCallStackFull(uint frameCount,bool print)

{
  size_t *this;
  ScriptContext *scriptContext;
  char16 cVar1;
  BOOL BVar2;
  int iVar3;
  ThreadContext *pTVar4;
  void *pvVar5;
  JavascriptFunction *this_00;
  FunctionBody *this_01;
  CallInfo CVar6;
  undefined4 extraout_var;
  char16 *pcVar7;
  Var *ppvVar8;
  ulong uVar9;
  undefined7 in_register_00000031;
  uint uVar10;
  char16 local_598;
  char16 local_596 [3];
  WCHAR buffer [512];
  char16 debugStringBuffer [42];
  undefined1 local_138 [8];
  JavascriptStackWalker walker;
  StringBuilder<Memory::ArenaAllocator> sb;
  char16_t *local_50;
  WCHAR *sourceFileName;
  uint local_40;
  ULONG local_3c;
  LONG local_38;
  ULONG line;
  LONG column;
  
  sourceFileName._4_4_ = (undefined4)CONCAT71(in_register_00000031,print);
  local_40 = frameCount;
  pTVar4 = ThreadContext::GetContextForCurrentThread();
  scriptContext = pTVar4->scriptContextList;
  Js::JavascriptStackWalker::JavascriptStackWalker
            ((JavascriptStackWalker *)local_138,scriptContext,true,(PVOID)0x0,false);
  walker.currentFrame.stackCheckCodeHeight = (size_t)&scriptContext->generalAllocator;
  this = &walker.currentFrame.stackCheckCodeHeight;
  line = 0;
  do {
    do {
      BVar2 = Js::JavascriptStackWalker::Walk((JavascriptStackWalker *)local_138,true);
      if (BVar2 == 0) goto LAB_007580da;
      pvVar5 = Js::JavascriptStackWalker::GetCurrentCodeAddr((JavascriptStackWalker *)local_138);
    } while (((walker.inlinedFrameCallInfo._0_2_ & 4) == 0) &&
            ((walker.inlinedFrameCallInfo._0_2_ & 1) == 0));
    StringCchPrintfW(&local_598,0x200,L"0x%p  ",pvVar5);
    if (local_598 != L'\0') {
      pcVar7 = local_596;
      cVar1 = local_598;
      do {
        Js::StringBuilder<Memory::ArenaAllocator>::Append
                  ((StringBuilder<Memory::ArenaAllocator> *)this,cVar1);
        cVar1 = *pcVar7;
        pcVar7 = pcVar7 + 1;
      } while (cVar1 != L'\0');
    }
    this_00 = Js::JavascriptStackWalker::GetCurrentFunction((JavascriptStackWalker *)local_138,true)
    ;
    this_01 = Js::JavascriptFunction::GetFunctionBody(this_00);
    CVar6 = Js::JavascriptStackWalker::GetCallInfo((JavascriptStackWalker *)local_138,true);
    local_50 = L"NULL";
    local_3c = 0;
    local_38 = 0;
    Js::JavascriptStackWalker::GetSourcePosition
              ((JavascriptStackWalker *)local_138,&local_50,&local_3c,&local_38);
    iVar3 = (*(this_01->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this_01);
    pcVar7 = Js::FunctionProxy::GetDebugNumberSet
                       ((FunctionProxy *)this_01,(wchar (*) [42])(buffer + 0x1fc));
    uVar10 = CVar6._0_4_ & 0xffffff;
    StringCchPrintfW(&local_598,0x200,L"%s [%s] (0x%p, Args=%u",CONCAT44(extraout_var,iVar3),pcVar7,
                     this_00,uVar10);
    if (local_598 != L'\0') {
      pcVar7 = local_596;
      cVar1 = local_598;
      do {
        Js::StringBuilder<Memory::ArenaAllocator>::Append
                  ((StringBuilder<Memory::ArenaAllocator> *)this,cVar1);
        cVar1 = *pcVar7;
        pcVar7 = pcVar7 + 1;
      } while (cVar1 != L'\0');
    }
    if (((ulong)CVar6 & 0xffffff) != 0) {
      uVar9 = 0;
      do {
        ppvVar8 = Js::JavascriptStackWalker::GetJavascriptArgs
                            ((JavascriptStackWalker *)local_138,false);
        StringCchPrintfW(&local_598,0x200,L", 0x%p",ppvVar8[uVar9]);
        if (local_598 != L'\0') {
          pcVar7 = local_596;
          cVar1 = local_598;
          do {
            Js::StringBuilder<Memory::ArenaAllocator>::Append
                      ((StringBuilder<Memory::ArenaAllocator> *)this,cVar1);
            cVar1 = *pcVar7;
            pcVar7 = pcVar7 + 1;
          } while (cVar1 != L'\0');
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != (CVar6._0_4_ & 0xffffff));
    }
    StringCchPrintfW(&local_598,0x200,L")[%s (%u, %d)]\n",local_50,(ulong)(local_3c + 1),
                     (ulong)(local_38 + 1),uVar10);
    if (local_598 != L'\0') {
      pcVar7 = local_596;
      cVar1 = local_598;
      do {
        Js::StringBuilder<Memory::ArenaAllocator>::Append
                  ((StringBuilder<Memory::ArenaAllocator> *)this,cVar1);
        cVar1 = *pcVar7;
        pcVar7 = pcVar7 + 1;
      } while (cVar1 != L'\0');
    }
    line = line + 1;
  } while (line < local_40);
LAB_007580da:
  Js::StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<72ul>
            ((StringBuilder<Memory::ArenaAllocator> *)&walker.currentFrame.stackCheckCodeHeight,
             (char16 (*) [72])0x100617c);
  pcVar7 = Js::StringBuilder<Memory::ArenaAllocator>::Detach
                     ((StringBuilder<Memory::ArenaAllocator> *)
                      &walker.currentFrame.stackCheckCodeHeight);
  if (sourceFileName._4_1_ != '\0') {
    Output::Print(pcVar7);
  }
  Js::JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_138);
  return pcVar7;
}

Assistant:

WCHAR* DumpCallStackFull(uint frameCount, bool print)
{
    Js::ScriptContext* scriptContext = ThreadContext::GetContextForCurrentThread()->GetScriptContextList();
    Js::JavascriptStackWalker walker(scriptContext);

    WCHAR buffer[512];
    Js::StringBuilder<ArenaAllocator> sb(scriptContext->GeneralAllocator());
    uint fc = 0;
    while (walker.Walk())
    {
        void * codeAddr = walker.GetCurrentCodeAddr();
        if (walker.IsJavascriptFrame())
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            StringCchPrintf(buffer, _countof(buffer), _u("0x%p  "), codeAddr);
            sb.AppendSz(buffer);
            // Found a JavascriptFunction.  Dump its name and parameters.
            Js::JavascriptFunction *jsFunc = walker.GetCurrentFunction();

            Js::FunctionBody * jsBody = jsFunc->GetFunctionBody();
            const Js::CallInfo callInfo = walker.GetCallInfo();
            const WCHAR* sourceFileName = _u("NULL");
            ULONG line = 0; LONG column = 0;
            walker.GetSourcePosition(&sourceFileName, &line, &column);

            StringCchPrintf(buffer, _countof(buffer), _u("%s [%s] (0x%p, Args=%u"), jsBody->GetDisplayName(), jsBody->GetDebugNumberSet(debugStringBuffer), jsFunc,
                callInfo.Count);
            sb.AppendSz(buffer);

            for (uint i = 0; i < callInfo.Count; i++)
            {
                StringCchPrintf(buffer, _countof(buffer), _u(", 0x%p"), walker.GetJavascriptArgs(false /*boxArgs*/)[i]);
                sb.AppendSz(buffer);
            }
            StringCchPrintf(buffer, _countof(buffer), _u(")[%s (%u, %d)]\n"), sourceFileName, line + 1, column + 1);
            sb.AppendSz(buffer);
            fc++;
            if(fc >= frameCount)
            {
                break;
            }
       }
    }
    sb.AppendCppLiteral(_u("----------------------------------------------------------------------\n"));
    WCHAR* stack = sb.Detach();
    if(print)
    {
        Output::Print(stack);
    }
    return stack;
}